

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_feature(lysp_yang_ctx *ctx,lysp_feature **features)

{
  lysp_ext_instance **exts;
  lysp_feature *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  char *pcVar4;
  uint16_t *puVar5;
  ly_stmt parent_stmt;
  ly_ctx *plVar6;
  long lVar7;
  void *parent;
  Elf64_Ehdr *exts_00;
  uint16_t *puVar8;
  char **str_p;
  bool bVar9;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar10;
  ly_stmt in_stack_ffffffffffffff94;
  char *local_68;
  size_t local_60;
  uint16_t *local_58;
  lysp_qname **local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  long local_38;
  
  plVar1 = *features;
  if (plVar1 == (lysp_feature *)0x0) {
    plVar3 = (long *)malloc(0x48);
    if (plVar3 != (long *)0x0) {
      *plVar3 = 1;
      goto LAB_0017d5a6;
    }
  }
  else {
    lVar7 = *(long *)&plVar1[-1].flags + 1;
    *(long *)&plVar1[-1].flags = lVar7;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar7 * 0x40 | 8);
    if (plVar3 != (long *)0x0) {
LAB_0017d5a6:
      *features = (lysp_feature *)(plVar3 + 1);
      lVar7 = *plVar3;
      plVar3[lVar7 * 8 + -1] = 0;
      (plVar3 + lVar7 * 8 + -1)[1] = 0;
      plVar3[lVar7 * 8 + -3] = 0;
      (plVar3 + lVar7 * 8 + -3)[1] = 0;
      plVar3[lVar7 * 8 + -5] = 0;
      (plVar3 + lVar7 * 8 + -5)[1] = 0;
      plVar3[lVar7 * 8 + -7] = 0;
      (plVar3 + lVar7 * 8 + -7)[1] = 0;
      exts_00 = (Elf64_Ehdr *)&stack0xffffffffffffffc8;
      LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_68,(char **)exts_00,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2 + (LVar2 == LY_SUCCESS);
      }
      str_p = (char **)(plVar3 + lVar7 * 8 + -7);
      if (local_38 == 0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = local_68;
        if (local_60 == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar6,pcVar4,local_60,str_p);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar6,local_68,str_p);
      }
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (in_stack_ffffffffffffff94 == LY_STMT_SYNTAX_SEMICOLON) {
        bVar9 = true;
      }
      else {
        if (in_stack_ffffffffffffff94 != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar6 = (ly_ctx *)0x0;
          }
          else {
            plVar6 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
          ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
          return LY_EVALID;
        }
        LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        bVar9 = in_stack_ffffffffffffff94 == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      uVar10 = CONCAT13(bVar9,(int3)in_stack_ffffffffffffff90);
      if (bVar9 != false) {
        return LY_SUCCESS;
      }
      puVar8 = (uint16_t *)(plVar3 + lVar7 * 8);
      exts = (lysp_ext_instance **)(puVar8 + -4);
      local_48 = puVar8 + -8;
      local_50 = (lysp_qname **)(puVar8 + -0x18);
      local_58 = puVar8 + -0xc;
      local_40 = puVar8;
      do {
        if ((int)in_stack_ffffffffffffff94 < 0x130000) {
          if (in_stack_ffffffffffffff94 == LY_STMT_DESCRIPTION) {
            parent = *(void **)local_58;
            parent_stmt = LY_STMT_DESCRIPTION;
            puVar5 = local_58;
LAB_0017d817:
            exts_00 = (Elf64_Ehdr *)0x2;
            LVar2 = parse_text_field(ctx,parent,parent_stmt,(uint32_t)puVar5,(char **)0x2,
                                     Y_IDENTIF_ARG,(uint16_t *)exts,
                                     (lysp_ext_instance **)
                                     CONCAT44(in_stack_ffffffffffffff94,uVar10));
          }
          else {
            if (in_stack_ffffffffffffff94 != LY_STMT_EXTENSION_INSTANCE) {
LAB_0017d8fb:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(in_stack_ffffffffffffff94);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"feature");
              return LY_EVALID;
            }
            exts_00 = &Elf64_Ehdr_00100000;
            LVar2 = parse_ext(ctx,local_68,local_60,str_p,LY_STMT_FEATURE,0,exts);
          }
        }
        else if (in_stack_ffffffffffffff94 == LY_STMT_IF_FEATURE) {
          LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_50,(yang_arg)exts,
                               (lysp_ext_instance **)exts_00);
        }
        else {
          if (in_stack_ffffffffffffff94 == LY_STMT_REFERENCE) {
            parent = *(void **)local_48;
            parent_stmt = LY_STMT_REFERENCE;
            puVar5 = local_48;
            goto LAB_0017d817;
          }
          if (in_stack_ffffffffffffff94 != LY_STMT_STATUS) goto LAB_0017d8fb;
          LVar2 = parse_status(ctx,local_40,exts);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        LVar2 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff94,&local_68,&local_60);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        if (in_stack_ffffffffffffff94 == LY_STMT_SYNTAX_RIGHT_BRACE) {
          uVar10 = CONCAT13(1,(int3)uVar10);
          if ((*(void **)(puVar8 + -4) != (void *)0x0) &&
             (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*(void **)(puVar8 + -4),'\x01',
                                 (uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
        }
        if ((char)((uint)uVar10 >> 0x18) != '\0') {
          return LY_SUCCESS;
        }
      } while( true );
    }
    *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + -1;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar6 = (ly_ctx *)0x0;
  }
  else {
    plVar6 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_feature");
  return LY_EMEM;
}

Assistant:

LY_ERR
parse_feature(struct lysp_yang_ctx *ctx, struct lysp_feature **features)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_feature *feat;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *features, feat, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, feat->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, feat->dsc, LY_STMT_DESCRIPTION, 0, &feat->dsc, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &feat->iffeatures, Y_STR_ARG, &feat->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, feat->ref, LY_STMT_REFERENCE, 0, &feat->ref, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &feat->flags, &feat->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, feat, LY_STMT_FEATURE, 0, &feat->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "feature");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, feat->exts, ret, cleanup);
    }

cleanup:
    return ret;
}